

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O2

void nk_glfw3_font_stash_end(void)

{
  undefined8 in_RAX;
  void *pvVar1;
  nk_handle texture;
  int h;
  int w;
  
  _h = in_RAX;
  pvVar1 = nk_font_atlas_bake(&glfw.atlas,&w,&h,NK_FONT_ATLAS_RGBA32);
  (*glad_glGenTextures)(1,(GLuint *)0x1992e0);
  (*glad_glBindTexture)(0xde1,glfw.ogl.font_tex);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glTexImage2D)(0xde1,0,0x1908,w,(GLsizei)_h,0,0x1908,0x1401,pvVar1);
  texture = nk_handle_id(glfw.ogl.font_tex);
  nk_font_atlas_end(&glfw.atlas,texture,&glfw.ogl.null);
  if (glfw.atlas.default_font != (nk_font *)0x0) {
    nk_style_set_font(&glfw.ctx,&(glfw.atlas.default_font)->handle);
  }
  return;
}

Assistant:

NK_API void
nk_glfw3_font_stash_end(void)
{
    const void *image; int w, h;
    image = nk_font_atlas_bake(&glfw.atlas, &w, &h, NK_FONT_ATLAS_RGBA32);
    nk_glfw3_device_upload_atlas(image, w, h);
    nk_font_atlas_end(&glfw.atlas, nk_handle_id((int)glfw.ogl.font_tex), &glfw.ogl.null);
    if (glfw.atlas.default_font)
        nk_style_set_font(&glfw.ctx, &glfw.atlas.default_font->handle);
}